

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__new_buf(void *p,size_t size)

{
  stbtt__buf sVar1;
  int local_28;
  size_t size_local;
  void *p_local;
  stbtt__buf r;
  
  if (size < 0x40000000) {
    local_28 = (int)size;
    sVar1.cursor = 0;
    sVar1.data = (uchar *)p;
    sVar1.size = local_28;
    return sVar1;
  }
  __assert_fail("size < 0x40000000",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imstb_truetype.h"
                ,0x482,"stbtt__buf stbtt__new_buf(const void *, size_t)");
}

Assistant:

static stbtt__buf stbtt__new_buf(const void *p, size_t size)
{
   stbtt__buf r;
   STBTT_assert(size < 0x40000000);
   r.data = (stbtt_uint8*) p;
   r.size = (int) size;
   r.cursor = 0;
   return r;
}